

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
CompactSizeFormatter<true>::
Unser<ParamsStream<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>&,CNetAddr::SerParams>,unsigned_long>
          (CompactSizeFormatter<true> *this,
          ParamsStream<ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
          *s,unsigned_long *v)

{
  long lVar1;
  uint64_t uVar2;
  unsigned_long uVar3;
  error_code *this_00;
  uint64_t *in_RDX;
  long in_FS_OFFSET;
  bool in_stack_00000017;
  ParamsStream<ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
  *in_stack_00000018;
  uint64_t n;
  error_code *peVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = ReadCompactSize<ParamsStream<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>&,CNetAddr::SerParams>>
                    (in_stack_00000018,in_stack_00000017);
  uVar3 = std::numeric_limits<unsigned_long>::min();
  if (uVar3 <= uVar2) {
    uVar3 = std::numeric_limits<unsigned_long>::max();
    if (uVar2 <= uVar3) {
      *in_RDX = uVar2;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      goto LAB_0087c63c;
    }
  }
  this_00 = (error_code *)__cxa_allocate_exception(0x20);
  peVar4 = this_00;
  std::error_code::error_code<std::io_errc,void>(this_00,(io_errc)((ulong)this_00 >> 0x20));
  std::ios_base::failure[abi:cxx11]::failure
            ((char *)peVar4,(error_code *)"CompactSize exceeds limit of type");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    __cxa_throw(this_00,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
LAB_0087c63c:
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, I& v)
    {
        uint64_t n = ReadCompactSize<Stream>(s, RangeCheck);
        if (n < std::numeric_limits<I>::min() || n > std::numeric_limits<I>::max()) {
            throw std::ios_base::failure("CompactSize exceeds limit of type");
        }
        v = n;
    }